

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageDataOperations.h
# Opt level: O1

void fe::operations::
     applyOperationT<fe::operations::op_blend_one_invSrcAlpha,fe::PixelB8G8R8A8,fe::PixelDISTANCE>
               (op_blend_one_invSrcAlpha *op,PixelB8G8R8A8 *srcPixelFormat,
               PixelDISTANCE *destPixelFormat,ImageData *src,ImageData *dest)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  int iVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  uint8_t uVar10;
  uint uVar11;
  
  bVar4 = check(src,dest);
  if ((bVar4) && (iVar1 = (dest->super_fe_image).h, iVar1 != 0)) {
    iVar2 = (dest->super_fe_image).w;
    puVar8 = (dest->super_fe_image).data;
    puVar9 = (src->super_fe_image).data;
    iVar7 = 0;
    iVar3 = iVar2;
    puVar6 = puVar9;
    puVar5 = puVar8;
    do {
      for (; iVar3 != 0; iVar3 = iVar3 + -1) {
        uVar11 = (uint)(byte)~puVar9[3] + (uint)puVar9[3];
        uVar10 = (uint8_t)uVar11;
        if (0xfe < uVar11) {
          uVar10 = 0xff;
        }
        *puVar8 = uVar10;
        puVar8 = puVar8 + (dest->super_fe_image).bytespp;
        puVar9 = puVar9 + (src->super_fe_image).bytespp;
      }
      puVar9 = puVar6 + (src->super_fe_image).pitch;
      puVar8 = puVar5 + (dest->super_fe_image).pitch;
      iVar7 = iVar7 + 1;
      iVar3 = iVar2;
      puVar6 = puVar9;
      puVar5 = puVar8;
    } while (iVar7 != iVar1);
  }
  return;
}

Assistant:

void applyOperationT(const Op& op, const Src& srcPixelFormat, Dest& destPixelFormat, const ImageData& src, const ImageData& dest)
        {
            if (!check(src, dest))
                return;

            const unsigned char* srcBuffer = (unsigned char*)src.data;
            unsigned char* destBuffer = (unsigned char*)dest.data;

            int w = dest.w;
            int h = dest.h;

            for (int y = 0; y != h; ++y)
            {
                const unsigned char* srcLine = srcBuffer;
                unsigned char* destLine = destBuffer;

                for (int x = 0; x != w; ++x)
                {
                    op(srcPixelFormat, destPixelFormat, srcLine, destLine, x, y);

                    destLine += dest.bytespp;
                    srcLine += src.bytespp;
                }

                srcBuffer += src.pitch;
                destBuffer += dest.pitch;
            }
        }